

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O0

void __thiscall xs::ExecutionRequestHandler::pollKeepAlives(ExecutionRequestHandler *this)

{
  int iVar1;
  ProtocolError *this_00;
  reference elemBuf;
  size_type sVar2;
  deUint64 dVar3;
  ExecutionRequestHandler *__n;
  void *__buf;
  SimpleMessage<102> local_78;
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator<char> local_39;
  string local_38;
  deUint64 local_18;
  deUint64 curTime;
  ExecutionRequestHandler *this_local;
  
  curTime = (deUint64)this;
  local_18 = deGetMicroseconds();
  if (30000000 < local_18 - this->m_lastKeepAliveReceived) {
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    this_00 = (ProtocolError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Keepalive timeout occurred",&local_39);
    ProtocolError::ProtocolError(this_00,&local_38);
    buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(this_00,&ProtocolError::typeinfo,ProtocolError::~ProtocolError);
  }
  if (5000000 < local_18 - this->m_lastKeepAliveSent) {
    __n = this;
    iVar1 = de::RingBuffer<unsigned_char>::getNumFree(&this->m_bufferOut);
    if (7 < iVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      SimpleMessage<102>::SimpleMessage(&local_78);
      SimpleMessage<102>::write(&local_78,(int)local_68,__buf,(size_t)__n);
      SimpleMessage<102>::~SimpleMessage(&local_78);
      elemBuf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
      de::RingBuffer<unsigned_char>::pushFront(&this->m_bufferOut,elemBuf,(int)sVar2);
      dVar3 = deGetMicroseconds();
      this->m_lastKeepAliveSent = dVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    }
  }
  return;
}

Assistant:

void ExecutionRequestHandler::pollKeepAlives (void)
{
	deUint64 curTime = deGetMicroseconds();

	// Check that we've got keepalives in timely fashion.
	if (curTime - m_lastKeepAliveReceived > KEEPALIVE_TIMEOUT*1000)
		throw ProtocolError("Keepalive timeout occurred");

	// Send some?
	if (curTime - m_lastKeepAliveSent > KEEPALIVE_SEND_INTERVAL*1000 &&
		m_bufferOut.getNumFree() >= MESSAGE_HEADER_SIZE)
	{
		vector<deUint8> buf;
		KeepAliveMessage().write(buf);
		m_bufferOut.pushFront(&buf[0], (int)buf.size());

		m_lastKeepAliveSent = deGetMicroseconds();
	}
}